

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

void __thiscall
vkt::api::anon_unknown_1::Environment::Environment
          (Environment *this,Context *context,deUint32 maxResourceConsumers_)

{
  deUint32 dVar1;
  DeviceInterface *pDVar2;
  VkDevice pVVar3;
  
  this->vkp = context->m_platformInterface;
  pDVar2 = Context::getDeviceInterface(context);
  this->vkd = pDVar2;
  pVVar3 = Context::getDevice(context);
  this->device = pVVar3;
  dVar1 = Context::getUniversalQueueFamilyIndex(context);
  this->queueFamilyIndex = dVar1;
  this->programBinaries = context->m_progCollection;
  this->allocationCallbacks = (VkAllocationCallbacks *)0x0;
  this->maxResourceConsumers = maxResourceConsumers_;
  return;
}

Assistant:

Environment (Context& context, deUint32 maxResourceConsumers_)
		: vkp					(context.getPlatformInterface())
		, vkd					(context.getDeviceInterface())
		, device				(context.getDevice())
		, queueFamilyIndex		(context.getUniversalQueueFamilyIndex())
		, programBinaries		(context.getBinaryCollection())
		, allocationCallbacks	(DE_NULL)
		, maxResourceConsumers	(maxResourceConsumers_)
	{
	}